

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void log_command_list(void)

{
  char local_218 [8];
  char encbuf [512];
  uint local_c;
  int i;
  
  local_c = 0;
  while (cmdlist[(int)local_c].name != (char *)0x0) {
    local_c = local_c + 1;
  }
  lprintf("%x",(ulong)local_c);
  local_c = 0;
  while (cmdlist[(int)local_c].name != (char *)0x0) {
    base64_encode(cmdlist[(int)local_c].name,local_218);
    lprintf(" %s",local_218);
    local_c = local_c + 1;
  }
  lprintf("\n");
  return;
}

Assistant:

static void log_command_list(void)
{
    int i;
    char encbuf[ENCBUFSZ];
    
    for (i = 0; cmdlist[i].name; i++)
	;
    lprintf("%x", i);
    for (i = 0; cmdlist[i].name; i++) {
	base64_encode(cmdlist[i].name, encbuf);
	lprintf(" %s", encbuf);
    }
    lprintf("\n");
}